

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_10a125::CpuAbsoluteTest_rla_sets_c_and_n_Test::TestBody
          (CpuAbsoluteTest_rla_sets_c_and_n_Test *this)

{
  (this->super_CpuAbsoluteTest).super_CpuTest.registers.p = '\x02';
  (this->super_CpuAbsoluteTest).super_CpuTest.registers.a = 0xf0;
  (this->super_CpuAbsoluteTest).super_CpuTest.expected.a = 0x80;
  (this->super_CpuAbsoluteTest).super_CpuTest.expected.p = 0x81;
  (this->super_CpuAbsoluteTest).super_CpuTest.field_0x114 = 0xc1;
  CpuAbsoluteTest::run_readwrite_instruction(&this->super_CpuAbsoluteTest,'/',0x82);
  return;
}

Assistant:

TEST_F(CpuAbsoluteTest, rla_sets_c_and_n) {
    registers.p = Z_FLAG;
    registers.a = 0b11110000;
    expected.a = 0b10000000;
    expected.p = C_FLAG | N_FLAG;
    memory_content = 0b11000001;

    run_readwrite_instruction(RLA_ABS, 0b10000010);
}